

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::TestOutputStream::~TestOutputStream(TestOutputStream *this)

{
  TestOutputStream *this_local;
  
  ~TestOutputStream(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

~TestOutputStream() {}